

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::torrent::on_force_recheck(torrent *this,status_t status,storage_error *error)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  bool local_8a;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> local_64;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> local_60;
  undefined1 local_5a;
  uchar local_59;
  bitfield_flag local_58;
  undefined1 local_57;
  uchar local_56;
  bitfield_flag local_55;
  undefined1 local_54;
  uchar local_53;
  bitfield_flag local_52;
  bool local_51;
  undefined1 auStack_50 [7];
  bool has_error_status;
  undefined1 local_40 [19];
  bitfield_flag local_2d [13];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  storage_error *error_local;
  torrent *this_local;
  status_t status_local;
  
  local_20._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)error;
  error_local = (storage_error *)this;
  this_local._7_1_ = status.m_val;
  state_updated(this);
  if ((*(ulong *)&(this->super_torrent_hot_members).field_0x48 >> 0x1a & 1) == 0) {
    local_40[0x12] = this_local._7_1_;
    local_40[0x11] = 8;
    local_2d[0] = (bitfield_flag)
                  libtorrent::flags::operator&
                            ((bitfield_flag<unsigned_char,_libtorrent::disk_storage_status_tag,_void>
                              )this_local._7_1_,
                             (bitfield_flag<unsigned_char,_libtorrent::disk_storage_status_tag,_void>
                              )0x8);
    bVar1 = libtorrent::flags::bitfield_flag::operator_cast_to_bool(local_2d);
    if (bVar1) {
      iVar2 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                _vptr_session_logger[5])();
      bVar1 = alert_manager::should_post<libtorrent::oversized_file_alert>
                        ((alert_manager *)CONCAT44(extraout_var,iVar2));
      if (bVar1) {
        iVar2 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                  _vptr_session_logger[5])();
        get_handle((torrent *)local_40);
        alert_manager::emplace_alert<libtorrent::oversized_file_alert,libtorrent::torrent_handle>
                  ((alert_manager *)CONCAT44(extraout_var_00,iVar2),(torrent_handle *)local_40);
        torrent_handle::~torrent_handle((torrent_handle *)local_40);
      }
    }
    bVar1 = storage_error::operator_cast_to_bool((storage_error *)local_20._M_pi);
    if (bVar1) {
      ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)auStack_50,"force_recheck");
      handle_disk_error(this,_auStack_50,(storage_error *)local_20._M_pi,(peer_connection *)0x0,none
                       );
    }
    else {
      local_53 = this_local._7_1_;
      local_54 = 1;
      local_52 = (bitfield_flag)
                 libtorrent::flags::operator&
                           ((bitfield_flag<unsigned_char,_libtorrent::disk_storage_status_tag,_void>
                            )this_local._7_1_,
                            (bitfield_flag<unsigned_char,_libtorrent::disk_storage_status_tag,_void>
                            )0x1);
      bVar1 = libtorrent::flags::bitfield_flag::operator_cast_to_bool(&local_52);
      local_8a = true;
      if (!bVar1) {
        local_56 = this_local._7_1_;
        local_57 = 2;
        local_55 = (bitfield_flag)
                   libtorrent::flags::operator&
                             ((bitfield_flag<unsigned_char,_libtorrent::disk_storage_status_tag,_void>
                               )this_local._7_1_,
                              (bitfield_flag<unsigned_char,_libtorrent::disk_storage_status_tag,_void>
                               )0x2);
        bVar1 = libtorrent::flags::bitfield_flag::operator_cast_to_bool(&local_55);
        local_8a = true;
        if (!bVar1) {
          local_59 = this_local._7_1_;
          local_5a = 4;
          local_58 = (bitfield_flag)
                     libtorrent::flags::operator&
                               ((bitfield_flag<unsigned_char,_libtorrent::disk_storage_status_tag,_void>
                                 )this_local._7_1_,
                                (bitfield_flag<unsigned_char,_libtorrent::disk_storage_status_tag,_void>
                                 )0x4);
          local_8a = libtorrent::flags::bitfield_flag::operator_cast_to_bool(&local_58);
        }
      }
      local_51 = local_8a;
      if (local_8a == false) {
        files_checked(this);
      }
      else {
        this->field_0x606 = this->field_0x606 & 0xf0;
        *(undefined2 *)&this->field_0x604 = 0;
        strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::strong_typedef(&local_60,0);
        (this->m_checking_piece).m_val = local_60.m_val;
        strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::strong_typedef(&local_64,0);
        (this->m_num_checked_pieces).m_val = local_64.m_val;
        set_state(this,checking_files);
        if ((*(uint *)&this->field_0x600 & 1) != 0) {
          pause(this);
        }
        bVar1 = should_check_files(this);
        if (bVar1) {
          start_checking(this);
        }
        else {
          (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
            [0x2c])();
        }
      }
    }
  }
  return;
}

Assistant:

void torrent::on_force_recheck(status_t const status, storage_error const& error) try
	{
		TORRENT_ASSERT(is_single_thread());

		// hold a reference until this function returns
		state_updated();

		if (m_abort) return;

		if (status & disk_status::oversized_file)
		{
			if (m_ses.alerts().should_post<oversized_file_alert>())
				m_ses.alerts().emplace_alert<oversized_file_alert>(get_handle());
		}

		if (error)
		{
			handle_disk_error("force_recheck", error);
			return;
		}
		bool const has_error_status
			= (status & disk_status::fatal_disk_error)
			|| (status & disk_status::need_full_check)
			|| (status & disk_status::file_exist);
		if (!has_error_status)
		{
			// if there are no files, just start
			files_checked();
		}
		else
		{
			m_progress_ppm = 0;
			m_checking_piece = piece_index_t(0);
			m_num_checked_pieces = piece_index_t(0);

			set_state(torrent_status::checking_files);
			if (m_auto_managed) pause(torrent_handle::graceful_pause);
			if (should_check_files()) start_checking();
			else m_ses.trigger_auto_manage();
		}
	}
	catch (...) { handle_exception(); }